

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O2

void __thiscall
slang::IntervalMapDetails::Path::
replaceRoot<slang::IntervalMapDetails::BranchNode<unsigned_long,8u,true>>
          (Path *this,BranchNode<unsigned_long,_8U,_true> *node,uint32_t size,IndexPair offset)

{
  pointer pEVar1;
  ulong uVar2;
  Entry local_10;
  
  pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  pEVar1->node = node;
  pEVar1->size = size;
  pEVar1->offset = offset.first;
  pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar2 = *(ulong *)((long)pEVar1->node + (ulong)pEVar1->offset * 8);
  local_10.node = (void *)(uVar2 & 0xffffffffffffffc0);
  local_10.size = ((uint)uVar2 & 0x3f) + 1;
  local_10.offset = offset.second;
  SmallVectorBase<slang::IntervalMapDetails::Path::Entry>::
  emplace<slang::IntervalMapDetails::Path::Entry>
            ((SmallVectorBase<slang::IntervalMapDetails::Path::Entry> *)this,pEVar1 + 1,&local_10);
  return;
}

Assistant:

void replaceRoot(TNode* node, uint32_t size, IndexPair offset) {
        SLANG_ASSERT(!path.empty());
        path.front() = Entry(node, size, offset.first);
        path.insert(path.begin() + 1, Entry(childAt(0), offset.second));
    }